

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_shape.cxx
# Opt level: O0

void __thiscall Fl_Window::shape(Fl_Window *this,Fl_Image *img)

{
  Fl_Image *img_local;
  Fl_Window *this_local;
  
  return;
}

Assistant:

void Fl_Window::shape(const Fl_Image* img) {
#if FLTK_ABI_VERSION >= 10303
  if (shape_data_) {
    if (shape_data_->todelete_) { delete shape_data_->todelete_; }
#if defined(__APPLE__)
    if (shape_data_->mask) { CGImageRelease(shape_data_->mask); }
#endif
    }
  else {
    shape_data_ = new shape_data_type;
    }
  memset(shape_data_, 0, sizeof(shape_data_type));
  border(false);
  int d = img->d();
  if (d && img->count() >= 2) shape_pixmap_((Fl_Image*)img);
  else if (d == 0) shape_bitmap_((Fl_Image*)img);
  else if (d == 2 || d == 4) shape_alpha_((Fl_Image*)img, d - 1);
  else if ((d == 1 || d == 3) && img->count() == 1) shape_alpha_((Fl_Image*)img, 0);
#endif
}